

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::SpecparamSymbol::resolvePathPulse(SpecparamSymbol *this)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Symbol *pSVar2;
  Symbol *in_RDI;
  bool in_stack_00000027;
  Scope *in_stack_00000028;
  SpecparamSymbol *in_stack_00000030;
  SourceLocation in_stack_00000038;
  string_view in_stack_00000040;
  basic_string_view<char,_std::char_traits<char>_> dest;
  basic_string_view<char,_std::char_traits<char>_> source;
  size_type index;
  anon_class_24_3_83a3a2c4 nameError;
  SourceLocation loc;
  basic_string_view<char,_std::char_traits<char>_> path;
  basic_string_view<char,_std::char_traits<char>_> prefix;
  Scope *parent;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  SourceLocation *delta;
  SourceLocation *this_00;
  size_type in_stack_ffffffffffffff48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  char __c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  anon_class_24_3_83a3a2c4 *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  Scope **local_60;
  SourceLocation *local_58;
  basic_string_view<char,_std::char_traits<char>_> *local_50;
  SourceLocation local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_t local_30;
  char *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  Scope *local_10 [2];
  
  __c = (char)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  *(undefined1 *)((long)&in_RDI[5].originatingSyntax + 1) = 1;
  if (((ulong)in_RDI[5].name._M_str & 1) != 0) {
    local_10[0] = Symbol::getParentScope(in_RDI);
    local_20 = ::sv(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_30 = local_20._M_len;
    local_28 = local_20._M_str;
    __x._M_str = (char *)in_stack_ffffffffffffff70;
    __x._M_len = in_stack_ffffffffffffff68;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                      (in_stack_ffffffffffffff60,__x);
    if ((bVar1) && (pSVar2 = Scope::asSymbol(local_10[0]), pSVar2->kind == SpecifyBlock)) {
      this_00 = (SourceLocation *)&in_RDI->name;
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
      local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_type)in_RDI);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_40);
      if (!bVar1) {
        delta = &in_RDI->location;
        std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
        local_48 = SourceLocation::operator+<unsigned_long>(this_00,(unsigned_long)delta);
        local_60 = local_10;
        local_58 = &local_48;
        local_50 = &local_40;
        local_68 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (in_stack_ffffffffffffff60,__c,(size_type)in_stack_ffffffffffffff50);
        if (local_68 == 0xffffffffffffffff) {
          resolvePathPulse::anon_class_24_3_83a3a2c4::operator()(in_stack_ffffffffffffff70);
        }
        else {
          local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                (size_type)in_RDI);
          local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                (size_type)in_RDI);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_78);
          if ((bVar1) ||
             (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_88), bVar1
             )) {
            resolvePathPulse::anon_class_24_3_83a3a2c4::operator()(in_stack_ffffffffffffff70);
          }
          else {
            pSVar2 = resolvePathTerminal(in_stack_00000030,in_stack_00000040,in_stack_00000028,
                                         in_stack_00000038,in_stack_00000027);
            in_RDI[5].nextInScope = pSVar2;
            std::basic_string_view<char,_std::char_traits<char>_>::length(&local_78);
            SourceLocation::operator+<unsigned_long>(this_00,(unsigned_long)delta);
            pSVar2 = resolvePathTerminal(in_stack_00000030,in_stack_00000040,in_stack_00000028,
                                         in_stack_00000038,in_stack_00000027);
            *(Symbol **)&in_RDI[5].indexInScope = pSVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SpecparamSymbol::resolvePathPulse() const {
    pathPulseResolved = true;
    if (!isPathPulse)
        return;

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto prefix = "PATHPULSE$"sv;
    if (name.starts_with(prefix) && parent->asSymbol().kind == SymbolKind::SpecifyBlock) {
        auto path = name.substr(prefix.length());
        if (!path.empty()) {
            auto loc = location + prefix.length();
            auto nameError = [&] {
                parent->addDiag(diag::PathPulseInvalidPathName,
                                SourceRange{loc, loc + path.length()})
                    << path;
            };

            auto index = path.find('$');
            if (index == std::string_view::npos) {
                nameError();
                return;
            }

            auto source = path.substr(0, index);
            auto dest = path.substr(index + 1);
            if (source.empty() || dest.empty()) {
                nameError();
                return;
            }

            pathSource = resolvePathTerminal(source, *parent, loc,
                                             /* isSource */ true);
            pathDest = resolvePathTerminal(dest, *parent, loc + source.length(),
                                           /* isSource */ false);
        }
    }
}